

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoopStatement.cpp
# Opt level: O1

string * __thiscall
ninx::parser::element::NoopStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,NoopStatement *this,int level)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)level);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::NoopStatement::dump(int level) const {
    return std::string(level, '\t')+" NOOP";
}